

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

int PatchMusic(int dummy)

{
  int iVar1;
  char *in_RAX;
  char *newString;
  FString *this;
  FString keystring;
  FString local_38;
  
  local_38.Chars = in_RAX;
  DPrintf(4,"[Music]\n");
  iVar1 = GetLine();
  while (iVar1 == 1) {
    newString = skipwhite(Line2);
    local_38.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    this = FString::operator+=(&local_38,"MUSIC_");
    FString::operator+=(this,Line1);
    FStringTable::SetString(&GStrings,local_38.Chars,newString);
    DPrintf(4,"Music %s set to:\n%s\n",local_38.Chars,newString);
    FString::~FString(&local_38);
    iVar1 = GetLine();
  }
  return iVar1;
}

Assistant:

static int PatchMusic (int dummy)
{
	int result;

	DPrintf (DMSG_SPAMMY, "[Music]\n");

	while ((result = GetLine()) == 1)
	{
		const char *newname = skipwhite (Line2);
		FString keystring;
		
		keystring << "MUSIC_" << Line1;

		GStrings.SetString (keystring, newname);
		DPrintf (DMSG_SPAMMY, "Music %s set to:\n%s\n", keystring.GetChars(), newname);
	}

	return result;
}